

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

PSNode * __thiscall
dg::pta::PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNodeAlloc*&,unsigned_long>
          (PointerGraph *this,PSNodeAlloc **args,unsigned_long *args_1)

{
  type pPVar1;
  PSNode **in_RDX;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *in_RSI;
  unsigned_long *unaff_retaddr;
  PSNode *n;
  
  pPVar1 = nodeFactory<(dg::pta::PSNodeType)4,dg::pta::PSNodeAlloc*&,unsigned_long,dg::pta::PSNodeGep>
                     ((PointerGraph *)args_1,(PSNodeAlloc **)n,unaff_retaddr);
  std::
  vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
  ::emplace_back<dg::pta::PSNode*&>(in_RSI,in_RDX);
  return &pPVar1->super_PSNode;
}

Assistant:

PSNode *create(Args &&...args) {
        PSNode *n = nodeFactory<Type>(std::forward<Args>(args)...);
        nodes.emplace_back(n); // C++17 returns a referece
        assert(n->getID() == nodes.size() - 1);
        return n;
    }